

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall Memory::HeapInfo::FinishPartialCollect(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  long lVar1;
  
  lVar1 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::FinishPartialCollect
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar1),recyclerSweep);
    lVar1 = lVar1 + 0x380;
  } while (lVar1 != 0xa878);
  lVar1 = 0;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::FinishPartialCollect
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar1),recyclerSweep);
    lVar1 = lVar1 + 0x380;
  } while (lVar1 != 0x6580);
  LargeHeapBucket::FinishPartialCollect(&this->largeObjectBucket,recyclerSweep);
  return;
}

Assistant:

void HeapInfo::FinishPartialCollect(RecyclerSweep * recyclerSweep)
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].FinishPartialCollect(recyclerSweep);
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].FinishPartialCollect(recyclerSweep);
    }
#endif

    largeObjectBucket.FinishPartialCollect(recyclerSweep);
}